

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Config_testZeroSamplingParam_Test::~Config_testZeroSamplingParam_Test
          (Config_testZeroSamplingParam_Test *this)

{
  Config_testZeroSamplingParam_Test *this_local;
  
  ~Config_testZeroSamplingParam_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Config, testZeroSamplingParam)
{
    {
        constexpr auto kConfigYAML = R"cfg(
sampler:
    param: 0
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ(0, config.sampler().param());
    }
}